

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::(anonymous_namespace)::PluginName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view plugin_prefix,
          string_view directive)

{
  string *psVar1;
  char *pcVar2;
  AlphaNum local_90;
  _anonymous_namespace_ *local_60;
  size_t local_58;
  AlphaNum local_30;
  
  pcVar2 = plugin_prefix._M_str;
  local_58 = plugin_prefix._M_len;
  local_90.piece_._M_len = 4;
  local_90.piece_._M_str = "gen-";
  local_60 = this;
  if ((char *)0x1 < pcVar2) {
    local_30.piece_._M_len = (size_t)(pcVar2 + -2);
    if (pcVar2 + -6 <= pcVar2 + -2) {
      local_30.piece_._M_len = (size_t)(pcVar2 + -6);
    }
    local_30.piece_._M_str = (char *)(directive._M_len + 2);
    psVar1 = absl::lts_20250127::StrCat_abi_cxx11_
                       (__return_storage_ptr__,(lts_20250127 *)&local_60,&local_90,&local_30,
                        (AlphaNum *)local_30.piece_._M_str);
    return psVar1;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",2,pcVar2
             ,directive._M_len,directive._M_str);
}

Assistant:

std::string PluginName(absl::string_view plugin_prefix,
                       absl::string_view directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return absl::StrCat(plugin_prefix, "gen-",
                      directive.substr(2, directive.size() - 6));
}